

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O0

void aom_highbd_quantize_b_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 *puVar8;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 *in_stack_00000008;
  __m256i eob;
  int step;
  __m256i dq_1;
  __m256i q_1;
  __m256i nz_mask_1;
  __m256i abs_dq_1;
  __m256i abs_q_1;
  __m256i tmp2_1;
  __m256i tmp_1;
  __m256i tmp_rnd_1;
  __m256i zero_1;
  __m256i zbin_mask_1;
  __m256i abs_coeff_1;
  __m256i coeff_1;
  __m256i dq;
  __m256i q;
  __m256i nz_mask;
  __m256i abs_dq;
  __m256i abs_q;
  __m256i tmp2;
  __m256i tmp;
  __m256i tmp_rnd;
  __m256i zero;
  __m256i zbin_mask;
  __m256i abs_coeff;
  __m256i coeff;
  __m256i eob_s;
  __m256i nz_iscan;
  __m256i iscan_plus1;
  __m256i iscan_1;
  __m256i packed_nz_mask_perm;
  __m256i packed_nz_mask;
  __m256i nz_iscan_1;
  __m256i iscan_plus1_1;
  __m256i iscan_2;
  __m256i packed_nz_mask_perm_1;
  __m256i packed_nz_mask_1;
  int in_stack_ffffffffffffeee8;
  longlong local_1100;
  longlong lStack_10f8;
  longlong lStack_10f0;
  longlong lStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10a0;
  __m256i *in_stack_ffffffffffffef68;
  __m256i *in_stack_ffffffffffffef70;
  __m256i *in_stack_ffffffffffffef78;
  int16_t *in_stack_ffffffffffffef80;
  int16_t *in_stack_ffffffffffffef88;
  int16_t *in_stack_ffffffffffffef90;
  int16_t *in_stack_ffffffffffffef98;
  undefined1 auVar11 [32];
  long local_1010;
  undefined1 (*local_1008) [32];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long lStack_ea8;
  ulong uStack_e18;
  undefined8 uStack_df8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  long lStack_ca8;
  ulong uStack_c18;
  undefined8 uStack_bf8;
  undefined1 local_bc0 [32];
  
  auVar11 = ZEXT1632(ZEXT816(0));
  init_qp((int16_t *)0x0,in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
          in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,
          in_stack_ffffffffffffeee8);
  puVar8 = in_stack_00000008;
  auVar3 = *in_RDI;
  auVar2 = *in_RDI;
  auVar10 = vpabsd_avx2(*in_RDI);
  auVar9._8_8_ = lStack_10f8;
  auVar9._0_8_ = local_1100;
  auVar9._16_8_ = lStack_10f0;
  auVar9._24_8_ = lStack_10e8;
  auVar9 = vpcmpgtd_avx2(auVar10,auVar9);
  lStack_ca8 = auVar9._24_8_;
  if ((((((((((((((((((((((((((((((((auVar9 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar9 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar9 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                 && (auVar9 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar9 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar9 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar9 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar9 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar9 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar9 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar9 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar9 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar9 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar9 >> 0x7f,0) == '\0') &&
                    (auVar9 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar9 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar9 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar9 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar9 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar9 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar9 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar9 >> 0xbf,0) == '\0') &&
            (auVar9 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar9 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar9 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar9 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar9 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar9 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar9 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < lStack_ca8) {
    uStack_bf8 = SUB328(ZEXT832(0),4);
    *in_stack_00000008 = 0;
    in_stack_00000008[1] = uStack_bf8;
    in_stack_00000008[2] = 0;
    in_stack_00000008[3] = 0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    *(undefined8 *)(qcoeff_ptr + 2) = uStack_bf8;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
  }
  else {
    auVar1._8_8_ = uStack_10d8;
    auVar1._0_8_ = local_10e0;
    auVar1._16_8_ = uStack_10d0;
    auVar1._24_8_ = uStack_10c8;
    auVar10 = vpaddd_avx2(auVar10,auVar1);
    auVar10 = vpand_avx2(auVar10,auVar9);
    auVar9 = auVar10;
    mm256_mul_shift_epi32(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
    auVar10 = vpaddd_avx2(auVar9,auVar10);
    mm256_mul_shift_epi32(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
    auVar6._8_8_ = in_stack_ffffffffffffef68;
    auVar6._0_8_ = local_10a0;
    auVar6._16_8_ = in_stack_ffffffffffffef70;
    auVar6._24_8_ = in_stack_ffffffffffffef78;
    auVar1 = vpmulld_avx2(auVar10,auVar6);
    uStack_c18 = SUB328(ZEXT832(0),4);
    auVar9 = vpcmpgtd_avx2(auVar10,ZEXT832(uStack_c18) << 0x40);
    auVar10 = vpsignd_avx2(auVar10,auVar2);
    auVar2 = vpsignd_avx2(auVar1,auVar3);
    local_dc0 = auVar10._0_8_;
    uStack_db8 = auVar10._8_8_;
    uStack_db0 = auVar10._16_8_;
    uStack_da8 = auVar10._24_8_;
    *puVar8 = local_dc0;
    puVar8[1] = uStack_db8;
    puVar8[2] = uStack_db0;
    puVar8[3] = uStack_da8;
    local_de0 = auVar2._0_8_;
    uStack_dd8 = auVar2._8_8_;
    uStack_dd0 = auVar2._16_8_;
    uStack_dc8 = auVar2._24_8_;
    *(undefined8 *)qcoeff_ptr = local_de0;
    *(undefined8 *)(qcoeff_ptr + 2) = uStack_dd8;
    *(undefined8 *)(qcoeff_ptr + 4) = uStack_dd0;
    *(undefined8 *)(qcoeff_ptr + 6) = uStack_dc8;
    auVar10 = vpackssdw_avx2(auVar9,auVar9);
    auVar9 = vpermq_avx2(auVar10,0xd8);
    auVar10 = vpsubw_avx2(ZEXT1632(*(undefined1 (*) [16])scan),auVar9);
    auVar10 = vpand_avx2(auVar10,auVar9);
    auVar11 = vpmaxsw_avx2(auVar11,auVar10);
  }
  local_1008 = in_RDI + 1;
  in_stack_00000008 = in_stack_00000008 + 4;
  qcoeff_ptr = qcoeff_ptr + 8;
  scan = scan + 8;
  update_qp((__m256i *)&local_1100);
  for (local_1010 = in_RSI + -8; puVar8 = in_stack_00000008, 0 < local_1010;
      local_1010 = local_1010 + -8) {
    auVar3 = *local_1008;
    auVar2 = *local_1008;
    auVar10 = vpabsd_avx2(*local_1008);
    auVar4._8_8_ = lStack_10f8;
    auVar4._0_8_ = local_1100;
    auVar4._16_8_ = lStack_10f0;
    auVar4._24_8_ = lStack_10e8;
    auVar9 = vpcmpgtd_avx2(auVar10,auVar4);
    lStack_ea8 = auVar9._24_8_;
    if ((((((((((((((((((((((((((((((((auVar9 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                     && (auVar9 >> 0xf & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                    (auVar9 >> 0x17 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar9 >> 0x27 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                 (auVar9 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                && (auVar9 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar9 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (auVar9 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar9 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar9 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar9 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar9 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar9 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar9 >> 0x7f,0) == '\0') &&
                      (auVar9 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar9 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar9 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar9 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar9 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar9 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar9 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar9 >> 0xbf,0) == '\0') &&
              (auVar9 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar9 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar9 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar9 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar9 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar9 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar9 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < lStack_ea8) {
      uStack_df8 = SUB328(ZEXT832(0),4);
      *in_stack_00000008 = 0;
      in_stack_00000008[1] = uStack_df8;
      in_stack_00000008[2] = 0;
      in_stack_00000008[3] = 0;
      qcoeff_ptr[0] = 0;
      qcoeff_ptr[1] = 0;
      *(undefined8 *)(qcoeff_ptr + 2) = uStack_df8;
      qcoeff_ptr[4] = 0;
      qcoeff_ptr[5] = 0;
      qcoeff_ptr[6] = 0;
      qcoeff_ptr[7] = 0;
    }
    else {
      auVar5._8_8_ = uStack_10d8;
      auVar5._0_8_ = local_10e0;
      auVar5._16_8_ = uStack_10d0;
      auVar5._24_8_ = uStack_10c8;
      auVar10 = vpaddd_avx2(auVar10,auVar5);
      auVar10 = vpand_avx2(auVar10,auVar9);
      auVar9 = auVar10;
      mm256_mul_shift_epi32(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
      auVar10 = vpaddd_avx2(auVar9,auVar10);
      mm256_mul_shift_epi32(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
      auVar7._8_8_ = in_stack_ffffffffffffef68;
      auVar7._0_8_ = local_10a0;
      auVar7._16_8_ = in_stack_ffffffffffffef70;
      auVar7._24_8_ = in_stack_ffffffffffffef78;
      auVar1 = vpmulld_avx2(auVar10,auVar7);
      uStack_e18 = SUB328(ZEXT832(0),4);
      auVar9 = vpcmpgtd_avx2(auVar10,ZEXT832(uStack_e18) << 0x40);
      auVar10 = vpsignd_avx2(auVar10,auVar2);
      auVar2 = vpsignd_avx2(auVar1,auVar3);
      local_fc0 = auVar10._0_8_;
      uStack_fb8 = auVar10._8_8_;
      uStack_fb0 = auVar10._16_8_;
      uStack_fa8 = auVar10._24_8_;
      *puVar8 = local_fc0;
      puVar8[1] = uStack_fb8;
      puVar8[2] = uStack_fb0;
      puVar8[3] = uStack_fa8;
      local_fe0 = auVar2._0_8_;
      uStack_fd8 = auVar2._8_8_;
      uStack_fd0 = auVar2._16_8_;
      uStack_fc8 = auVar2._24_8_;
      *(undefined8 *)qcoeff_ptr = local_fe0;
      *(undefined8 *)(qcoeff_ptr + 2) = uStack_fd8;
      *(undefined8 *)(qcoeff_ptr + 4) = uStack_fd0;
      *(undefined8 *)(qcoeff_ptr + 6) = uStack_fc8;
      auVar10 = vpackssdw_avx2(auVar9,auVar9);
      auVar9 = vpermq_avx2(auVar10,0xd8);
      auVar10 = vpsubw_avx2(ZEXT1632(*(undefined1 (*) [16])scan),auVar9);
      auVar10 = vpand_avx2(auVar10,auVar9);
      auVar11 = vpmaxsw_avx2(auVar11,auVar10);
    }
    local_1008 = local_1008 + 1;
    in_stack_00000008 = in_stack_00000008 + 4;
    qcoeff_ptr = qcoeff_ptr + 8;
    scan = scan + 8;
  }
  local_bc0 = ZEXT832(auVar11._0_8_);
  auVar10 = vpshufd_avx2(local_bc0,0xe);
  auVar10 = vpmaxsw_avx2(ZEXT832(auVar11._0_8_),auVar10);
  auVar9 = vpshuflw_avx2(auVar10,0xe);
  auVar10 = vpmaxsw_avx2(auVar10,auVar9);
  auVar9 = vpshuflw_avx2(auVar10,1);
  auVar10 = vpmaxsw_avx2(auVar10,auVar9);
  *dequant_ptr = auVar10._0_2_;
  return;
}

Assistant:

void aom_highbd_quantize_b_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  const int step = 8;

  __m256i eob = _mm256_setzero_si256();
  __m256i qp[5];

  init_qp(zbin_ptr, round_ptr, quant_ptr, dequant_ptr, quant_shift_ptr, qp, 0);

  quantize(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);

  while (n_coeffs > 0) {
    quantize(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }

  *eob_ptr = get_max_eob(eob);
}